

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter3.cpp
# Opt level: O0

void __thiscall ApplicationContext::CreateCSP(ApplicationContext *this)

{
  CSP *pCVar1;
  CSP *in_RDI;
  shared_ptr<ApplicationContext> app;
  enable_shared_from_this<ApplicationContextBase> *in_stack_fffffffffffffde8;
  shared_ptr<ApplicationContext> *in_stack_fffffffffffffdf0;
  anon_class_16_1_ba1d3581 *in_stack_fffffffffffffdf8;
  function<void_(int)> *in_stack_fffffffffffffe00;
  function<void_(int)> *this_00;
  shared_ptr<ApplicationContextBase> *in_stack_fffffffffffffe08;
  function<void_(int)> *fn;
  char *name;
  anon_class_8_1_8991fb9c local_178 [39];
  size_t in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  CSP *in_stack_ffffffffffffffd0;
  char local_28 [40];
  
  fn = (function<void_(int)> *)csp_ac_src;
  strlen(csp_ac_src);
  pCVar1 = csp_parse(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  *(CSP **)&(in_RDI->q).producerCount = pCVar1;
  name = local_28;
  std::enable_shared_from_this<ApplicationContextBase>::shared_from_this(in_stack_fffffffffffffde8);
  std::dynamic_pointer_cast<ApplicationContext,ApplicationContextBase>(in_stack_fffffffffffffe08);
  std::shared_ptr<ApplicationContextBase>::~shared_ptr
            ((shared_ptr<ApplicationContextBase> *)0x12b9c1);
  std::shared_ptr<ApplicationContext>::shared_ptr
            (in_stack_fffffffffffffdf0,(shared_ptr<ApplicationContext> *)in_stack_fffffffffffffde8);
  std::function<void(int)>::function<ApplicationContext::CreateCSP()::_lambda(int)_1_,void>
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  csp_bind_lambda(in_RDI,name,fn);
  std::function<void_(int)>::~function((function<void_(int)> *)0x12ba31);
  CreateCSP()::{lambda(int)#1}::~CreateCSP((anon_class_16_1_ba1d3581 *)0x12ba3e);
  std::shared_ptr<ApplicationContext>::shared_ptr
            (in_stack_fffffffffffffdf0,(shared_ptr<ApplicationContext> *)in_stack_fffffffffffffde8);
  std::function<void(int)>::function<ApplicationContext::CreateCSP()::_lambda(int)_2_,void>
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  csp_bind_lambda(in_RDI,name,fn);
  std::function<void_(int)>::~function((function<void_(int)> *)0x12baa2);
  CreateCSP()::{lambda(int)#2}::~CreateCSP((anon_class_16_1_ba1d3581 *)0x12baaf);
  std::shared_ptr<ApplicationContext>::shared_ptr
            (in_stack_fffffffffffffdf0,(shared_ptr<ApplicationContext> *)in_stack_fffffffffffffde8);
  std::function<void(int)>::function<ApplicationContext::CreateCSP()::_lambda(int)_3_,void>
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  csp_bind_lambda(in_RDI,name,fn);
  std::function<void_(int)>::~function((function<void_(int)> *)0x12bb13);
  CreateCSP()::{lambda(int)#3}::~CreateCSP((anon_class_16_1_ba1d3581 *)0x12bb20);
  std::shared_ptr<ApplicationContext>::shared_ptr
            (in_stack_fffffffffffffdf0,(shared_ptr<ApplicationContext> *)in_stack_fffffffffffffde8);
  std::function<void(int)>::function<ApplicationContext::CreateCSP()::_lambda(int)_4_,void>
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  csp_bind_lambda(in_RDI,name,fn);
  std::function<void_(int)>::~function((function<void_(int)> *)0x12bb84);
  CreateCSP()::{lambda(int)#4}::~CreateCSP((anon_class_16_1_ba1d3581 *)0x12bb91);
  std::shared_ptr<ApplicationContext>::shared_ptr
            (in_stack_fffffffffffffdf0,(shared_ptr<ApplicationContext> *)in_stack_fffffffffffffde8);
  std::function<void(int)>::function<ApplicationContext::CreateCSP()::_lambda(int)_5_,void>
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  csp_bind_lambda(in_RDI,name,fn);
  std::function<void_(int)>::~function((function<void_(int)> *)0x12bbf5);
  CreateCSP()::{lambda(int)#5}::~CreateCSP((anon_class_16_1_ba1d3581 *)0x12bc02);
  this_00 = *(function<void_(int)> **)&(in_RDI->q).producerCount;
  std::shared_ptr<ApplicationContext>::shared_ptr
            (in_stack_fffffffffffffdf0,(shared_ptr<ApplicationContext> *)in_stack_fffffffffffffde8);
  std::function<void(int)>::function<ApplicationContext::CreateCSP()::_lambda(int)_6_,void>
            (this_00,in_stack_fffffffffffffdf8);
  csp_bind_lambda(in_RDI,name,fn);
  std::function<void_(int)>::~function((function<void_(int)> *)0x12bc66);
  CreateCSP()::{lambda(int)#6}::~CreateCSP((anon_class_16_1_ba1d3581 *)0x12bc73);
  std::function<void(int)>::function<ApplicationContext::CreateCSP()::_lambda(int)_7_,void>
            (this_00,local_178);
  csp_bind_lambda(in_RDI,name,fn);
  std::function<void_(int)>::~function((function<void_(int)> *)0x12bcc8);
  std::shared_ptr<ApplicationContext>::~shared_ptr((shared_ptr<ApplicationContext> *)0x12bcd5);
  return;
}

Assistant:

void CreateCSP()
    {
        csp = csp_parse(nullptr, csp_ac_src, strlen(csp_ac_src));

        /// The execution of actions becomes complicated by the introduction of
        /// undo. The first consideration is that we mustn't keep references to
        /// the application context in all the history's lambdas
        std::shared_ptr<ApplicationContext> app = std::dynamic_pointer_cast<ApplicationContext>(this->shared_from_this());

        csp_bind_lambda(csp, "push_value", [app](int id)
        {
            if (id && app)
            {
                ///>
                /// The append line event comes with a floating point value 
                ///<C++
                TypedData* d = blackboard_get(app->blackboard, id);
                auto td = dynamic_cast<Data<float>*>(d);
                if (td)
                {
///>
/// The operation modified the ApplicationContext, so record the operation
/// in the journal. The journal records both the action that was taken, 
/// and the reverse operation. The inverse of pushing a value on the stack is to pop it.
/// Previously, the journal was a simple record of an action.  Now,
/// we are going to explore more complex actions, with more complex undo
/// behavior. So a more sophisticated journal is required. Since the application
/// is multi-threaded, many actions could occur concurrently. In the case of
/// an action with a simple undo, that's no big deal, since one action is paired
/// with one undo action. In a moment though, we will see an undo action that
/// requires multiple steps that have to go together. We introduce therefore
/// a Journal::Transaction that records a single atomic history/undo pair.
///<C++
                    Journal::Transaction transaction 
                    {  "push_value", 
                        [app, td]() 
                        {
                            app->value_stack.push_back(td->value());
                        },
                        [app]() 
                        { 
                            app->value_stack.pop_back(); 
                        }
                    };
                    transaction.action();
                    app->journal.commit(std::move(transaction));
                }
                else
                {
                    ///>
                    /// The data from the blackboard is not reference counted
                    /// so it must be deleted here.
                    ///<C++
                    delete d;
                }
            }
        });
        csp_bind_lambda(csp, "pop_value", [app](int)
        {
            if (app->value_stack.size())
            {
                // remember the value that was at the back of the value stack.
                float value = *app->value_stack.rbegin();

                /// The inverse of popping a value is to push it again.
                Journal::Transaction transaction
                {
                    "pop_value",
                    [value, app]()
                    {
                        app->value_stack.pop_back();
                    },
                    [value, app]()
                    {
                        app->value_stack.push_back(value);
                    }
                };
                transaction.action();
                app->journal.commit(std::move(transaction));
            }
        });
        csp_bind_lambda(csp, "add", [app](int)
        {
            ///>
            /// This application is very simple, and doesn't report problems
            /// such as not enough values on the stack. A real application would.
            ///<C++
            if (app->value_stack.size() >= 2)
            {
                auto it = app->value_stack.rbegin();
                float value2 = *it++;
                float value1 = *it++;

                /// the history needs only record that an add occurred.
                /// The undo must remove the result, and push the original values.
                /// This is where the transactional nature of the journal comes
                /// into play.
                Journal::Transaction transaction
                {
                    "add",
                    [app, value1, value2]() 
                    {
                        app->value_stack.pop_back();
                        app->value_stack.pop_back();
                        app->value_stack.emplace_back(value1 + value2);
                    },
                    [app, value1, value2]() 
                    {
                        app->value_stack.pop_back();
                        app->value_stack.emplace_back(value1);
                        app->value_stack.emplace_back(value2);
                    }
                };
                transaction.action();
                app->journal.commit(std::move(transaction));
            }
        });
        csp_bind_lambda(csp, "subtract", [app](int)
        {
            if (app->value_stack.size() >= 2)
            {
                auto it = app->value_stack.rbegin();
                float value2 = *it++;
                float value1 = *it++;

                Journal::Transaction transaction
                {
                    "subtract",
                    [app, value1, value2]() 
                    {
                        app->value_stack.pop_back();
                        app->value_stack.pop_back();
                        app->value_stack.emplace_back(value1 - value2);
                    },
                    [app, value1, value2]() 
                    {
                        app->value_stack.pop_back();
                        app->value_stack.emplace_back(value1);
                        app->value_stack.emplace_back(value2);
                    }
                };
                transaction.action();
                app->journal.commit(std::move(transaction));
            }
        });
        csp_bind_lambda(csp, "multiply", [app](int)
        {
                auto it = app->value_stack.rbegin();
                float value2 = *it++;
                float value1 = *it++;

                Journal::Transaction transaction
                {
                    "multiply",
                    [app, value1, value2]() 
                    {
                        app->value_stack.pop_back();
                        app->value_stack.pop_back();
                        app->value_stack.emplace_back(value1 * value2);
                    },
                    [app, value1, value2]() 
                    {
                        app->value_stack.pop_back();
                        app->value_stack.emplace_back(value1);
                        app->value_stack.emplace_back(value2);
                    }
                };
                transaction.action();
                app->journal.commit(std::move(transaction));
        });
        csp_bind_lambda(csp, "divide", [app](int)
        {
            if (app->value_stack.size() >= 2)
            {
                auto it = app->value_stack.rbegin();
                float value2 = *it++;
                float value1 = *it++;

                Journal::Transaction transaction
                {
                    "divide",
                    [app, value1, value2]() 
                    {
                        app->value_stack.pop_back();
                        app->value_stack.pop_back();
                        app->value_stack.emplace_back(value1 / value2);
                    },
                    [app, value1, value2]() 
                    {
                        app->value_stack.pop_back();
                        app->value_stack.emplace_back(value1);
                        app->value_stack.emplace_back(value2);
                    }
                };
                transaction.action();
                app->journal.commit(std::move(transaction));
            }
        });
        ///>
        /// The join_now action is here, bound by name to the csp QUIT process.
        ///<C++
        csp_bind_lambda(csp, "join_now", [this](int) { join_now = true; });
    }